

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

ON_Interval
ON_BsplineControlPointSupport
          (int order,int control_point_count,double *knots,int control_point_index)

{
  ON_2dex OVar1;
  ON_Interval OVar2;
  int local_34;
  int iStack_30;
  ON_2dex active_spans;
  int control_point_index_local;
  double *knots_local;
  int control_point_count_local;
  int order_local;
  double local_10;
  
  if (knots != (double *)0x0) {
    OVar1 = ON_BsplineControlPointSpans(order,control_point_count,control_point_index);
    local_34 = OVar1.i;
    iStack_30 = OVar1.j;
    if (local_34 < iStack_30) {
      ON_Interval::ON_Interval
                ((ON_Interval *)&control_point_count_local,knots[local_34 + order + -2],
                 knots[iStack_30 + order + -2]);
      goto LAB_006958e6;
    }
  }
  _control_point_count_local = ON_Interval::Nan.m_t[0];
  local_10 = ON_Interval::Nan.m_t[1];
LAB_006958e6:
  OVar2.m_t[0] = _control_point_count_local;
  OVar2.m_t[1] = local_10;
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_DECL const ON_Interval ON_BsplineControlPointSupport(int order, int control_point_count, const double* knots, int control_point_index)
{
  for (;;)
  {
    if (nullptr == knots)
      break;
    const ON_2dex active_spans = ON_BsplineControlPointSpans(order, control_point_count, control_point_index);
    if (active_spans.i <  active_spans.j)
      return ON_Interval(knots[active_spans.i + order - 2], knots[active_spans.j + order - 2]);
    break;
  }  
  return ON_Interval::Nan;
}